

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode expect100(Curl_easy *data,connectdata *conn,dynbuf *req)

{
  _Bool _Var1;
  char *headerline;
  char *ptr;
  CURLcode result;
  dynbuf *req_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ptr._4_4_ = CURLE_OK;
  if ((((*(uint *)&(data->state).field_0x74c >> 8 & 1) == 0) &&
      (_Var1 = Curl_use_http_1_1plus(data,conn), _Var1)) && (conn->httpversion < 0x14)) {
    headerline = Curl_checkheaders(data,"Expect",6);
    if (headerline == (char *)0x0) {
      ptr._4_4_ = Curl_dyn_addn(req,"Expect: 100-continue\r\n",0x16);
      if (ptr._4_4_ == CURLE_OK) {
        *(uint *)&(data->state).field_0x74c =
             *(uint *)&(data->state).field_0x74c & 0xffffff7f | 0x80;
      }
    }
    else {
      _Var1 = Curl_compareheader(headerline,"Expect:",7,"100-continue",0xc);
      *(uint *)&(data->state).field_0x74c =
           *(uint *)&(data->state).field_0x74c & 0xffffff7f | (uint)_Var1 << 7;
    }
  }
  return ptr._4_4_;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct dynbuf *req)
{
  CURLcode result = CURLE_OK;
  if(!data->state.disableexpect && Curl_use_http_1_1plus(data, conn) &&
     (conn->httpversion < 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    const char *ptr = Curl_checkheaders(data, STRCONST("Expect"));
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, STRCONST("Expect:"), STRCONST("100-continue"));
    }
    else {
      result = Curl_dyn_addn(req, STRCONST("Expect: 100-continue\r\n"));
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}